

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorCircle.cpp
# Opt level: O0

void __thiscall ColorCircle::showLine(ColorCircle *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double yy;
  double xx;
  int i;
  ColorCircle *this_local;
  
  if (0 < (this->super_Colored).state_) {
    glColor3ub(0,0);
    dVar1 = (this->super_Colored).line_width_;
    glLineWidth(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1));
    glBegin(2);
    for (xx._4_4_ = 0; xx._4_4_ < this->shape_n_; xx._4_4_ = xx._4_4_ + 1) {
      dVar1 = (this->super_Colored).x_;
      dVar2 = (this->super_Colored).shape_scale_;
      dVar3 = this->r_;
      dVar7 = cos(((double)xx._4_4_ / (double)this->shape_n_) * 2.0 * 3.141592653589);
      dVar4 = (this->super_Colored).y_;
      dVar5 = (this->super_Colored).shape_scale_;
      dVar6 = this->r_;
      dVar8 = sin(((double)xx._4_4_ / (double)this->shape_n_) * 2.0 * 3.141592653589);
      Colored::myglVertex2d
                (&this->super_Colored,dVar2 * dVar3 * dVar7 + dVar1,dVar5 * dVar6 * dVar8 + dVar4);
    }
    glEnd();
  }
  return;
}

Assistant:

void ColorCircle::showLine(){
    if(state_ > 0){
        glColor3ub(0, 0, 0);
        glLineWidth((float)line_width_);
        glBegin(GL_LINE_LOOP);
        for(int i=0; i<shape_n_; i++)
        {
            double xx = x_ + shape_scale_ * r_ * cos( ((double)i)/shape_n_ * 2 * MYPI );
            double yy = y_ + shape_scale_ * r_ * sin( ((double)i)/shape_n_ * 2 * MYPI );
            myglVertex2d(xx,yy);
        }
        glEnd();
    }
}